

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

int __thiscall ncnn::Clip::forward_inplace(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  int i;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int _c;
  float fVar7;
  Mat local_70;
  
  if (bottom_top_blob->elemsize == 1) {
    forward_inplace_int8(this,bottom_top_blob,opt);
  }
  else {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w;
    uVar4 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar4;
    }
    iVar3 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar3 = 0;
    }
    while (_c = (int)uVar4, _c != iVar3) {
      Mat::channel(&local_70,bottom_top_blob,_c);
      pvVar2 = local_70.data;
      Mat::~Mat(&local_70);
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        fVar7 = *(float *)((long)pvVar2 + uVar4 * 4);
        fVar1 = this->min;
        if (fVar7 < fVar1) {
          *(float *)((long)pvVar2 + uVar4 * 4) = fVar1;
          fVar7 = fVar1;
        }
        if (this->max < fVar7) {
          *(float *)((long)pvVar2 + uVar4 * 4) = this->max;
        }
      }
      uVar4 = (ulong)(_c + 1);
    }
  }
  return 0;
}

Assistant:

int Clip::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (bottom_top_blob.elemsize == 1u)
    {
        return Clip::forward_inplace_int8(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < min)
                ptr[i] = min;
            if (ptr[i] > max)
                ptr[i] = max;
        }
    }

    return 0;
}